

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeTry(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  pointer *__k;
  Builder *this_01;
  uint32_t uVar1;
  Index index;
  Expression *body;
  value_type *pvVar2;
  size_type sVar3;
  Type type_00;
  Expression *value;
  LocalSet *left;
  Try *pTVar4;
  ulong uVar5;
  ulong uVar6;
  Module *pMVar7;
  ulong in_R8;
  __node_base_ptr p_Var8;
  long lVar9;
  bool bVar10;
  Name NVar11;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  undefined1 local_d0 [8];
  unordered_set<wasm::Tag_*,_std::hash<wasm::Tag_*>,_std::equal_to<wasm::Tag_*>,_std::allocator<wasm::Tag_*>_>
  usedTags;
  undefined1 auStack_78 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> catchBodies;
  undefined1 auStack_58 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> catchTags;
  Tag *tag;
  
  body = make(this,type);
  catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  catchBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  catchBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this_00 = &this->random;
  uVar1 = Random::upTo(this_00,(this->fuzzParams->super_FuzzParams).MAX_TRY_CATCHES);
  local_d0 = (undefined1  [8])&usedTags._M_h._M_rehash_policy._M_next_resize;
  usedTags._M_h._M_buckets = (__buckets_ptr)0x1;
  usedTags._M_h._M_bucket_count = 0;
  usedTags._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedTags._M_h._M_element_count._0_4_ = 0x3f800000;
  usedTags._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedTags._M_h._M_rehash_policy._4_4_ = 0;
  usedTags._M_h._M_rehash_policy._M_next_resize = 0;
  __k = &catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  while (bVar10 = uVar1 != 0, uVar1 = uVar1 - 1, bVar10) {
    pMVar7 = this->wasm;
    if ((pMVar7->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pMVar7->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      addTag(this);
      pMVar7 = this->wasm;
    }
    pvVar2 = Random::
             pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
                       (this_00,&pMVar7->tags);
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(pvVar2->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                  _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                  super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
    sVar3 = std::
            _Hashtable<wasm::Tag_*,_wasm::Tag_*,_std::allocator<wasm::Tag_*>,_std::__detail::_Identity,_std::equal_to<wasm::Tag_*>,_std::hash<wasm::Tag_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count((_Hashtable<wasm::Tag_*,_wasm::Tag_*,_std::allocator<wasm::Tag_*>,_std::__detail::_Identity,_std::equal_to<wasm::Tag_*>,_std::hash<wasm::Tag_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_d0,(key_type *)__k);
    if (sVar3 == 0) {
      std::__detail::
      _Insert_base<wasm::Tag_*,_wasm::Tag_*,_std::allocator<wasm::Tag_*>,_std::__detail::_Identity,_std::equal_to<wasm::Tag_*>,_std::hash<wasm::Tag_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<wasm::Tag_*,_wasm::Tag_*,_std::allocator<wasm::Tag_*>,_std::__detail::_Identity,_std::equal_to<wasm::Tag_*>,_std::hash<wasm::Tag_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_d0,(value_type *)__k);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,
                 catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    }
  }
  uVar6 = (ulong)((long)catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                        _M_impl.super__Vector_impl_data._M_start - (long)auStack_58) >> 4;
  if ((int)((ulong)((long)catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                          _M_impl.super__Vector_impl_data._M_start - (long)auStack_58) >> 4) != 0) {
    bVar10 = Random::oneIn(this_00,2);
    uVar5 = uVar6;
    if (!bVar10) goto LAB_001536b9;
  }
  uVar5 = uVar6 + 1;
LAB_001536b9:
  this_01 = &this->builder;
  usedTags._M_h._M_single_bucket = (__node_base_ptr)(uVar5 & 0xffffffff);
  lVar9 = 8;
  p_Var8 = (__node_base_ptr)0x0;
  do {
    if (usedTags._M_h._M_single_bucket == p_Var8) {
      type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
      pTVar4 = Builder::makeTry(this_01,body,
                                (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,
                                (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                auStack_78,type_02);
      std::
      _Hashtable<wasm::Tag_*,_wasm::Tag_*,_std::allocator<wasm::Tag_*>,_std::__detail::_Identity,_std::equal_to<wasm::Tag_*>,_std::hash<wasm::Tag_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Tag_*,_wasm::Tag_*,_std::allocator<wasm::Tag_*>,_std::__detail::_Identity,_std::equal_to<wasm::Tag_*>,_std::hash<wasm::Tag_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_d0);
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78
                );
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58);
      return (Expression *)pTVar4;
    }
    if (p_Var8 < (__node_base_ptr)(uVar6 & 0xffffffff)) {
      NVar11.super_IString.str._M_str = *(char **)((long)auStack_58 + lVar9 + -8);
      NVar11.super_IString.str._M_len = (size_t)this->wasm;
      wasm::Module::getTag(NVar11);
      type_00.id = wasm::HeapType::getSignature();
      if (type_00.id == 0) goto LAB_00153750;
      value = (Expression *)Builder::makePop(this_01,type_00);
      index = Builder::addVar(this->funcContext->func,type_00);
      left = Builder::makeLocalSet(this_01,index,value);
    }
    else {
LAB_00153750:
      left = (LocalSet *)0x0;
    }
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)make(this,type);
    if (left != (LocalSet *)0x0) {
      in_R8 = 0;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar5;
      catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)Builder::makeSequence
                              (this_01,(Expression *)left,
                               (Expression *)
                               catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,type_01);
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78,
               (value_type *)
               &catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    p_Var8 = (__node_base_ptr)((long)&p_Var8->_M_nxt + 1);
    lVar9 = lVar9 + 0x10;
  } while( true );
}

Assistant:

Expression* TranslateToFuzzReader::makeTry(Type type) {
  auto* body = make(type);
  std::vector<Name> catchTags;
  std::vector<Expression*> catchBodies;
  auto numTags = upTo(fuzzParams->MAX_TRY_CATCHES);
  std::unordered_set<Tag*> usedTags;
  for (Index i = 0; i < numTags; i++) {
    if (wasm.tags.empty()) {
      addTag();
    }
    auto* tag = pick(wasm.tags).get();
    if (usedTags.count(tag)) {
      continue;
    }
    usedTags.insert(tag);
    catchTags.push_back(tag->name);
  }
  // The number of tags in practice may be fewer than we planned.
  numTags = catchTags.size();
  auto numCatches = numTags;
  if (numTags == 0 || oneIn(2)) {
    // Add a catch-all.
    numCatches++;
  }
  for (Index i = 0; i < numCatches; i++) {
    // Catch bodies (aside from a catch-all) begin with a pop.
    Expression* prefix = nullptr;
    if (i < numTags) {
      auto tagType = wasm.getTag(catchTags[i])->params();
      if (tagType != Type::none) {
        auto* pop = builder.makePop(tagType);
        // Capture the pop in a local, so that it can be used later.
        // TODO: add a good chance for using this particular local in this catch
        // TODO: reuse an existing var if there is one
        auto index = builder.addVar(funcContext->func, tagType);
        prefix = builder.makeLocalSet(index, pop);
      }
    }
    auto* catchBody = make(type);
    if (prefix) {
      catchBody = builder.makeSequence(prefix, catchBody);
    }
    catchBodies.push_back(catchBody);
  }
  // TODO: delegate stuff
  return builder.makeTry(body, catchTags, catchBodies);
}